

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O3

int __thiscall menuwindow::find_selected(menuwindow *this,int mx,int my)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Fl_Menu_Item *pFVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  pFVar4 = this->menu;
  iVar5 = -1;
  if ((((pFVar4 != (Fl_Menu_Item *)0x0) && (pFVar4->text != (char *)0x0)) &&
      (iVar7 = my - (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                    super_Fl_Group.super_Fl_Widget.y_, -1 < iVar7)) &&
     (iVar7 < (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
              super_Fl_Widget.h_)) {
    iVar6 = mx - (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
                 super_Fl_Widget.x_;
    if (this->itemheight == 0) {
      iVar7 = 0;
      pFVar4 = Fl_Menu_Item::next(pFVar4,0);
      if (pFVar4->text != (char *)0x0) {
        iVar1 = 3;
        do {
          iVar3 = Fl_Menu_Item::measure(pFVar4,(int *)0x0,button);
          iVar1 = iVar1 + iVar3 + 0x10;
          if (iVar6 < iVar1) {
            return iVar7;
          }
          pFVar4 = Fl_Menu_Item::next(pFVar4,1);
          iVar7 = iVar7 + 1;
        } while (pFVar4->text != (char *)0x0);
      }
    }
    else {
      iVar1 = Fl::box_dx((uint)(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                               super_Fl_Group.super_Fl_Widget.box_);
      if ((iVar1 <= iVar6) &&
         (iVar6 < (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group
                  .super_Fl_Widget.w_)) {
        uVar2 = Fl::box_dx((uint)(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window
                                 .super_Fl_Group.super_Fl_Widget.box_);
        iVar7 = (int)((uVar2 ^ 0xffffffff) + iVar7) / this->itemheight;
        iVar5 = -1;
        if (iVar7 < this->numitems) {
          iVar5 = iVar7;
        }
        if (iVar7 < 0) {
          iVar5 = -1;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int menuwindow::find_selected(int mx, int my) {
  if (!menu || !menu->text) return -1;
  mx -= x();
  my -= y();
  if (my < 0 || my >= h()) return -1;
  if (!itemheight) { // menubar
    int xx = 3; int n = 0;
    const Fl_Menu_Item* m = menu ? menu->first() : 0;
    for (; ; m = m->next(), n++) {
      if (!m->text) return -1;
      xx += m->measure(0, button) + 16;
      if (xx > mx) break;
    }
    return n;
  }
  if (mx < Fl::box_dx(box()) || mx >= w()) return -1;
  int n = (my-Fl::box_dx(box())-1)/itemheight;
  if (n < 0 || n>=numitems) return -1;
  return n;
}